

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall Centaurus::NFA<wchar_t>::concat(NFA<wchar_t> *this,NFA<wchar_t> *nfa)

{
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  *this_00;
  pointer this_01;
  int offset_value;
  NFABaseState<wchar_t,_int> local_50;
  
  this_00 = &(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states;
  this_01 = (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
            super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  offset_value = (int)(((long)(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states
                              .
                              super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
                             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28) + -1;
  while (this_01 = this_01 + 1,
        this_01 !=
        (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
        super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
    NFABaseState<wchar_t,_int>::offset(&local_50,this_01,offset_value);
    std::
    vector<Centaurus::NFABaseState<wchar_t,int>,std::allocator<Centaurus::NFABaseState<wchar_t,int>>>
    ::emplace_back<Centaurus::NFABaseState<wchar_t,int>>
              ((vector<Centaurus::NFABaseState<wchar_t,int>,std::allocator<Centaurus::NFABaseState<wchar_t,int>>>
                *)this_00,&local_50);
    NFABaseState<wchar_t,_int>::~NFABaseState(&local_50);
  }
  NFABaseState<wchar_t,_int>::rebase_transitions
            ((this_00->
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start + offset_value,
             (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,offset_value);
  return;
}

Assistant:

void concat(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[initial_size - 1].rebase_transitions(nfa.m_states[0], initial_size - 1);
    }